

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::JESP_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  
  pvVar1 = state->input;
  if (key == 0x74) {
    *(undefined4 *)((long)pvVar1 + 0xac) = 1;
  }
  else {
    if (key != 2) {
      return 7;
    }
    sVar3 = strlen(arg);
    if (sVar3 == 1) {
      iVar2 = atoi(arg);
      *(int *)((long)pvVar1 + 0xe0) = iVar2;
    }
    else {
      iVar2 = strcmp(arg,"Exh");
      if (iVar2 == 0) {
        *(undefined4 *)((long)pvVar1 + 0xe0) = 0;
      }
      else {
        iVar2 = strcmp(arg,"DP");
        if (iVar2 != 0) {
          return 7;
        }
        *(undefined4 *)((long)pvVar1 + 0xe0) = 1;
      }
    }
  }
  return 0;
}

Assistant:

error_t
JESP_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case JESP_TYPE:
        if(strlen(arg)==1)
            theArgumentsStruc->jesp=static_cast<JESP_t>(atoi(arg));
        else if(strcmp(arg,"Exh")==0)
            theArgumentsStruc->jesp = JESPExhaustive;
        else if(strcmp(arg,"DP")==0)
            theArgumentsStruc->jesp = JESPDP;
        else
            return ARGP_ERR_UNKNOWN;
        break;
    case 't':
        theArgumentsStruc->saveTimings = 1;
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}